

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CounterUnitTest.cpp
# Opt level: O0

bool TestCompressionF<Counter<unsigned_long,64u>,Counter<unsigned_char,8u>>(int bias)

{
  Counter<unsigned_char,_8U> local_181;
  Counter<unsigned_long,_64U> local_180;
  Counter<unsigned_long,_64U> local_178;
  Counter<unsigned_char,_8U> local_169;
  Counter<unsigned_long,_64U> local_168;
  Counter<unsigned_long,_64U> local_160;
  Counter<unsigned_long,_64U> expanded;
  int delta_1;
  int delta;
  Counter<unsigned_char,_8U> truncatedRecent;
  Counter<unsigned_long,_64U> fullRecent;
  uint recent;
  Counter<unsigned_char,_8U> truncatedOriginal;
  Counter<unsigned_long,_64U> fullOriginal;
  uint original;
  uint range;
  int bias_local;
  char local_111;
  Counter<unsigned_char,_8U> *pCStack_110;
  int8_t gap;
  Counter<unsigned_long,_64U> *local_108;
  Counter<unsigned_long,_64U> *local_100;
  Counter<unsigned_long,_64U> local_f8;
  ulong local_f0;
  unsigned_long absDiff_1;
  ulong local_e0;
  unsigned_long absDiff;
  unsigned_long recentLow;
  Counter<unsigned_char,_8U> *local_c8;
  Counter<unsigned_long,_64U> *local_c0;
  Counter<unsigned_long,_64U> *local_b8;
  ThisType *result;
  Counter<unsigned_long,_64U> *local_a8;
  uint *local_a0;
  Counter<unsigned_long,_64U> *local_98;
  uint *local_90;
  Counter<unsigned_long,_64U> *local_88;
  int *local_80;
  Counter<unsigned_long,_64U> *local_78;
  Counter<unsigned_long,_64U> *local_70;
  Counter<unsigned_char,_8U> *local_68;
  Counter<unsigned_char,_8U> *local_60;
  Counter<unsigned_char,_8U> *local_58;
  Counter<unsigned_char,_8U> *local_50;
  unsigned_long *local_48;
  Counter<unsigned_long,_64U> *local_40;
  Counter<unsigned_long,_64U> *local_38;
  Counter<unsigned_long,_64U> *local_30;
  Counter<unsigned_char,_8U> *local_28;
  int *local_20;
  Counter<unsigned_char,_8U> *local_18;
  uint *local_10;
  
  fullOriginal.Value._0_4_ = 0;
  do {
    if (0x1ff < (uint)fullOriginal.Value) {
      return true;
    }
    Counter<unsigned_long,_64U>::Counter
              ((Counter<unsigned_long,_64U> *)&recent,(ulong)(uint)fullOriginal.Value);
    Counter<unsigned_char,_8U>::Counter
              ((Counter<unsigned_char,_8U> *)((long)&fullRecent.Value + 7),'\0');
    local_10 = &recent;
    local_18 = (Counter<unsigned_char,_8U> *)((long)&fullRecent.Value + 7);
    Counter<unsigned_char,_8U>::operator=(local_18,(uchar)_recent);
    for (fullRecent.Value._0_4_ = 0; (uint)fullRecent.Value < 0x200;
        fullRecent.Value._0_4_ = (uint)fullRecent.Value + 1) {
      Counter<unsigned_long,_64U>::Counter
                ((Counter<unsigned_long,_64U> *)&delta,(ulong)(uint)fullRecent.Value);
      Counter<unsigned_char,_8U>::Counter((Counter<unsigned_char,_8U> *)((long)&delta_1 + 3),'\0');
      local_20 = &delta;
      local_28 = (Counter<unsigned_char,_8U> *)((long)&delta_1 + 3);
      Counter<unsigned_char,_8U>::operator=(local_28,(uchar)_delta);
      if ((uint)fullRecent.Value < (uint)fullOriginal.Value) {
        if ((int)((uint)fullOriginal.Value - (uint)fullRecent.Value) < 0x80 - bias) {
LAB_00113f70:
          Counter<unsigned_long,_64U>::Counter(&local_168,(ThisType *)&delta);
          Counter<unsigned_char,_8U>::Counter(&local_169,(ThisType *)((long)&fullRecent.Value + 7));
          recentLow = (unsigned_long)bias;
          local_b8 = &local_160;
          local_c0 = &local_168;
          local_c8 = &local_169;
          local_50 = &local_169;
          local_a8 = &local_168;
          Counter<unsigned_long,_64U>::Counter
                    (&local_160,(ulong)local_169.Value | local_168.Value & 0xffffffffffffff00);
          result = &local_168;
          absDiff = local_168.Value & 0xff;
          local_58 = &local_169;
          if (absDiff < local_169.Value) {
            local_68 = &local_169;
            local_e0 = local_169.Value - absDiff;
            if (0x80 - recentLow <= local_e0) {
              Counter<unsigned_long,_64U>::Counter((Counter<unsigned_long,_64U> *)&absDiff_1,0x100);
              local_40 = &local_160;
              local_48 = &absDiff_1;
              local_160.Value = local_160.Value - absDiff_1;
            }
          }
          else {
            local_60 = &local_169;
            local_f0 = absDiff - local_169.Value;
            if (recentLow + 0x80 < local_f0) {
              Counter<unsigned_long,_64U>::Counter(&local_f8,0x100);
              local_30 = &local_160;
              local_38 = &local_f8;
              local_160.Value = local_160.Value + local_f8.Value;
            }
          }
          local_88 = &local_160;
          local_90 = &recent;
          if (local_160.Value != _recent) {
            return false;
          }
          if (bias == 0) {
            Counter<unsigned_long,_64U>::Counter(&local_180,(ThisType *)&delta);
            Counter<unsigned_char,_8U>::Counter
                      (&local_181,(ThisType *)((long)&fullRecent.Value + 7));
            local_100 = &local_178;
            local_108 = &local_180;
            pCStack_110 = &local_181;
            local_111 = local_181.Value - (char)local_180.Value;
            Counter<unsigned_long,_64U>::Counter
                      ((Counter<unsigned_long,_64U> *)&bias_local,(long)local_111);
            local_70 = &local_178;
            local_78 = &local_180;
            local_80 = &bias_local;
            Counter<unsigned_long,_64U>::Counter(&local_178,local_180.Value + _bias_local);
            Counter<unsigned_long,_64U>::operator=(&local_160,&local_178);
            local_98 = &local_160;
            local_a0 = &recent;
            if (local_160.Value != _recent) {
              return false;
            }
          }
        }
      }
      else {
        expanded.Value._4_4_ = (uint)fullRecent.Value - (uint)fullOriginal.Value;
        if (expanded.Value._4_4_ <= bias + 0x80) goto LAB_00113f70;
      }
    }
    fullOriginal.Value._0_4_ = (uint)fullOriginal.Value + 1;
  } while( true );
}

Assistant:

bool TestCompressionF(int bias)
{
    const unsigned range = SmallerT::kMSB << 2;

    for (unsigned original = 0; original < range; ++original)
    {
        LargerT fullOriginal = original;
        SmallerT truncatedOriginal;
        fullOriginal.TruncateTo(truncatedOriginal);

        for (unsigned recent = 0; recent < range; ++recent)
        {
            LargerT fullRecent = recent;
            SmallerT truncatedRecent;
            fullRecent.TruncateTo(truncatedRecent);

            // Skip cases we cannot handle
            if (recent < original)
            {
                int delta = original - recent;
                if (delta >= SmallerT::kMSB - bias)
                    continue;
            }
            else
            {
                int delta = recent - original;
                if (delta > SmallerT::kMSB + bias)
                    continue;
            }

#if 0
            // Useful for debugging
            int changeNeeded = (int)((fullOriginal.Get() >> Counter4::kBits) - (fullRecent.Get() >> Counter4::kBits));
            if (changeNeeded != 0)
            {
                std::cout << "orig=" << (int)fullOriginal.Get();
                std::cout << ", recent=" << (int)fullRecent.Get();
                std::cout << ", (T)orig=" << (int)truncatedOriginal.Get();
                std::cout << ", (T)recent=" << (int)truncatedRecent.Get();
                std::cout << ", delta=" << (int)(truncatedRecent.Get() - truncatedOriginal.Get());
                std::cout << ", Expected=" << changeNeeded;
                std::cout << std::endl;
            }
#endif

            LargerT expanded = LargerT::ExpandFromTruncatedWithBias(fullRecent, truncatedOriginal, bias);
            TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());

            if (bias == 0)
            {
                expanded = LargerT::ExpandFromTruncated(fullRecent, truncatedOriginal);
                TEST_CHECK(expanded.ToUnsigned() == fullOriginal.ToUnsigned());
            }
        }
    }

    return true;
}